

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O3

LPCSTR __thiscall NpyArray::SaveNPZ(NpyArray *this,string *zipname,string *varname,bool bAppend)

{
  size_t sVar1;
  size_t sVar2;
  pointer pcVar3;
  pointer __n;
  unsigned_short rhs;
  undefined4 uVar4;
  FILE *__stream;
  char *pcVar5;
  pointer pcVar6;
  byte bVar7;
  undefined7 in_register_00000009;
  uint rhs_00;
  ulong uVar8;
  size_t __off;
  uint16_t nrecs;
  vector<char,_std::allocator<char>_> localHeader;
  vector<char,_std::allocator<char>_> globalHeader;
  vector<char,_std::allocator<char>_> footer;
  vector<char,_std::allocator<char>_> npyHeader;
  size_t globalHeaderOffset;
  uint16_t local_fa;
  vector<char,_std::allocator<char>_> local_f8;
  vector<char,_std::allocator<char>_> local_d8;
  vector<char,_std::allocator<char>_> local_b8;
  vector<char,_std::allocator<char>_> local_98;
  size_t local_80;
  undefined8 local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_fa = 0;
  local_80 = 0;
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if ((int)CONCAT71(in_register_00000009,bAppend) == 0) {
LAB_00116fc9:
    __stream = fopen((zipname->_M_dataplus)._M_p,"wb");
    if (__stream == (FILE *)0x0) {
      pcVar5 = "error: unable to open file";
      goto LAB_0011739e;
    }
    __off = 0;
  }
  else {
    __stream = fopen((zipname->_M_dataplus)._M_p,"r+b");
    if (__stream == (FILE *)0x0) goto LAB_00116fc9;
    pcVar5 = ParseFooterZIP((FILE *)__stream,&local_fa,(size_t *)&local_98,&local_80);
    __off = local_80;
    if (pcVar5 != (LPCSTR)0x0) goto LAB_0011739e;
    fseek(__stream,local_80,0);
    __n = local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start;
    std::vector<char,_std::allocator<char>_>::resize
              (&local_d8,
               (size_type)
               local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start);
    pcVar6 = (pointer)fread(local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start,1,(size_t)__n,__stream);
    if (pcVar6 != __n) {
      pcVar5 = "error: header read error while adding to existing zip";
      goto LAB_0011739e;
    }
    fseek(__stream,__off,0);
  }
  bVar7 = this->type >> 7;
  CreateHeaderNPY(&local_98,&this->shape,(this->type ^ bVar7) - bVar7,this->wordSize);
  sVar1 = this->wordSize;
  sVar2 = this->numValues;
  uVar8 = (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
  uVar4 = crc32(0,local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start,uVar8 & 0xffffffff);
  local_78 = crc32(uVar4,this->data,(int)this->wordSize * (int)this->numValues);
  std::__cxx11::string::append((char *)varname);
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  add(&local_f8,"PK");
  add<unsigned_short>(&local_f8,0x403);
  add<unsigned_short>(&local_f8,0x14);
  add<unsigned_short>(&local_f8,0);
  add<unsigned_short>(&local_f8,0);
  add<unsigned_short>(&local_f8,0);
  add<unsigned_short>(&local_f8,0);
  add<unsigned_int>(&local_f8,(uint)local_78);
  rhs_00 = (int)uVar8 + (int)sVar1 * (int)sVar2;
  add<unsigned_int>(&local_f8,rhs_00);
  add<unsigned_int>(&local_f8,rhs_00);
  add<unsigned_short>(&local_f8,(unsigned_short)varname->_M_string_length);
  add<unsigned_short>(&local_f8,0);
  pcVar3 = (varname->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,pcVar3 + varname->_M_string_length);
  std::vector<char,std::allocator<char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((vector<char,std::allocator<char>> *)&local_f8,
             local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,local_50,local_50 + local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  add(&local_d8,"PK");
  add<unsigned_short>(&local_d8,0x201);
  add<unsigned_short>(&local_d8,0x14);
  std::vector<char,std::allocator<char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
            ((vector<char,std::allocator<char>> *)&local_d8,
             local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,
             local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + 4,
             local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + 0x1e);
  add<unsigned_short>(&local_d8,0);
  add<unsigned_short>(&local_d8,0);
  add<unsigned_short>(&local_d8,0);
  add<unsigned_int>(&local_d8,0);
  add<unsigned_int>(&local_d8,(uint)__off);
  pcVar3 = (varname->_M_dataplus)._M_p;
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + varname->_M_string_length);
  std::vector<char,std::allocator<char>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((vector<char,std::allocator<char>> *)&local_d8,
             local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish,local_70,local_70 + local_68);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  add(&local_b8,"PK");
  add<unsigned_short>(&local_b8,0x605);
  add<unsigned_short>(&local_b8,0);
  add<unsigned_short>(&local_b8,0);
  rhs = local_fa + 1;
  add<unsigned_short>(&local_b8,rhs);
  add<unsigned_short>(&local_b8,rhs);
  add<unsigned_int>(&local_b8,
                    (int)local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                    (int)local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
  add<unsigned_int>(&local_b8,
                    ((uint)__off + rhs_00 +
                    (int)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_finish) -
                    (int)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start);
  add<unsigned_short>(&local_b8,0);
  fwrite(local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(this->data,this->wordSize,this->numValues,__stream);
  fwrite(local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fwrite(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start,1,
         (long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,__stream);
  fclose(__stream);
  if (local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pcVar5 = (LPCSTR)0x0;
LAB_0011739e:
  if (local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return pcVar5;
}

Assistant:

LPCSTR NpyArray::SaveNPZ(std::string zipname, std::string varname, bool bAppend) const
{
	FILE* fp;
	uint16_t nrecs = 0;
	size_t globalHeaderOffset = 0;
	std::vector<char> globalHeader;
	if (bAppend && (fp=fopen(zipname.c_str(), "r+b")) != NULL) {
		// zip file exists, add a new NPY array to it;
		// first read the footer and parse the offset and size of the global header
		// then read and store the global header;
		// the new data will be written at the start of the global header,
		// then append the global header and footer below it
		size_t globalHeaderSize;
		LPCSTR ret = ParseFooterZIP(fp, nrecs, globalHeaderSize, globalHeaderOffset);
		if (ret != NULL)
			return ret;
		fseek(fp, (long)globalHeaderOffset, SEEK_SET);
		globalHeader.resize(globalHeaderSize);
		size_t res = fread(globalHeader.data(), sizeof(char), globalHeaderSize, fp);
		if (res != globalHeaderSize)
			return "error: header read error while adding to existing zip";
		fseek(fp, (long)globalHeaderOffset, SEEK_SET);
	} else {
		fp = fopen(zipname.c_str(), "wb");
	}
	if (!fp)
		return "error: unable to open file";

	const std::vector<char> npyHeader = CreateHeaderNPY(shape, std::abs(type), wordSize);
	const size_t nbytes = SizeBytes() + npyHeader.size();

	// get the CRC of the data to be added
	uint32_t crc = crc32(0L, (uint8_t*)npyHeader.data(), (uLong)npyHeader.size());
	crc = crc32(crc, Data(), (uLong)SizeBytes());

	// append NPY extension
	varname += ".npy";

	// build the local header
	std::vector<char> localHeader;
	add(localHeader, "PK"); // first part of signature
	add(localHeader, (uint16_t)0x0403); // second part of signature
	add(localHeader, (uint16_t)20); // min version to extract
	add(localHeader, (uint16_t)0); // general purpose bit flag
	add(localHeader, (uint16_t)0); // compression method
	add(localHeader, (uint16_t)0); // file last mod time
	add(localHeader, (uint16_t)0); // file last mod date
	add(localHeader, (uint32_t)crc); // CRC
	add(localHeader, (uint32_t)nbytes); // compressed size
	add(localHeader, (uint32_t)nbytes); // uncompressed size
	add(localHeader, (uint16_t)varname.size()); // variable name length
	add(localHeader, (uint16_t)0); // extra field length
	add(localHeader, varname);

	// build global header
	add(globalHeader, "PK"); // first part of signature
	add(globalHeader, (uint16_t)0x0201); // second part of signature
	add(globalHeader, (uint16_t)20); // version made by
	globalHeader.insert(globalHeader.end(), localHeader.begin()+4, localHeader.begin()+30);
	add(globalHeader, (uint16_t)0); // file comment length
	add(globalHeader, (uint16_t)0); // disk number where file starts
	add(globalHeader, (uint16_t)0); // internal file attributes
	add(globalHeader, (uint32_t)0); // external file attributes
	add(globalHeader, (uint32_t)globalHeaderOffset); // relative offset of local file header, since it begins where the global header used to begin
	add(globalHeader, varname);

	// build footer
	std::vector<char> footer;
	add(footer, "PK"); // first part of signature
	add(footer, (uint16_t)0x0605); // second part of signature
	add(footer, (uint16_t)0); // number of this disk
	add(footer, (uint16_t)0); // disk where footer starts
	add(footer, (uint16_t)(nrecs+1)); // number of records on this disk
	add(footer, (uint16_t)(nrecs+1)); // total number of records
	add(footer, (uint32_t)globalHeader.size()); // number of bytes of global headers
	add(footer, (uint32_t)(globalHeaderOffset + nbytes + localHeader.size())); // offset of start of global headers, since global header now starts after newly written array
	add(footer, (uint16_t)0); // zip file comment length

	// write everything
	fwrite(localHeader.data(), sizeof(char), localHeader.size(), fp);
	fwrite(npyHeader.data(), sizeof(char), npyHeader.size(), fp);
	fwrite(Data(), wordSize, numValues, fp);
	fwrite(globalHeader.data(), sizeof(char), globalHeader.size(), fp);
	fwrite(footer.data(), sizeof(char), footer.size(), fp);
	fclose(fp);
	return NULL;
}